

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void * fio_ls_remove(fio_ls_s *node)

{
  void *ret;
  fio_ls_s *node_local;
  
  if ((node == (fio_ls_s *)0x0) || (node->next == node)) {
    node_local = (fio_ls_s *)0x0;
  }
  else {
    node_local = (fio_ls_s *)node->obj;
    node->next->prev = node->prev;
    node->prev->next = node->next;
    free(node);
  }
  return node_local;
}

Assistant:

FIO_FUNC inline void *fio_ls_remove(fio_ls_s *node) {
  if (!node || node->next == node) {
    /* never remove the list's head */
    return NULL;
  }
  const void *ret = node->obj;
  node->next->prev = node->prev;
  node->prev->next = node->next;
  FIO_FREE(node);
  return (void *)ret;
}